

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::BaseCompiler::newInvokeNode
          (BaseCompiler *this,InvokeNode **out,InstId instId,Operand_ *o0,FuncSignature *signature)

{
  NodeFlags NVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  Error EVar4;
  int iVar5;
  OperandPack *__s;
  ulong uVar6;
  ulong extraout_RAX;
  Operand_ *unaff_R12;
  size_t size;
  BaseCompiler *unaff_R14;
  InvokeNode *unaff_R15;
  ZoneAllocator *local_50;
  InvokeNode **local_48;
  FuncSignature *local_40;
  size_t local_38;
  
  if ((this->super_BaseBuilder)._allocator._zone == (Zone *)0x0) {
    newInvokeNode();
  }
  else {
    local_50 = &(this->super_BaseBuilder)._allocator;
    unaff_R15 = (InvokeNode *)ZoneAllocator::_alloc(local_50,0x268,&local_38);
    unaff_R12 = o0;
    unaff_R14 = this;
    local_48 = out;
    local_40 = signature;
    if (unaff_R15 != (InvokeNode *)0x0) {
      (unaff_R15->super_InstNode).super_BaseNode.field_0.field_0._prev = (BaseNode *)0x0;
      (unaff_R15->super_InstNode).super_BaseNode.field_0.field_0._next = (BaseNode *)0x0;
      (unaff_R15->super_InstNode).super_BaseNode.field_1._any._nodeType = kInst;
      NVar1 = (this->super_BaseBuilder)._nodeFlags;
      (unaff_R15->super_InstNode).super_BaseNode._passData = (void *)0x0;
      (unaff_R15->super_InstNode).super_BaseNode._inlineComment = (char *)0x0;
      *(undefined8 *)&(unaff_R15->super_InstNode).super_BaseNode._position = 0;
      *(undefined8 *)((long)&(unaff_R15->super_InstNode).super_BaseNode.field_3 + 4) = 0;
      (unaff_R15->super_InstNode)._baseInst._id = instId;
      (unaff_R15->super_InstNode)._baseInst._options = kNone;
      (unaff_R15->super_InstNode).super_BaseNode.field_1._any._reserved1 = '\x04';
      memset(&unaff_R15->_funcDetail,0,0x19c);
      unaff_R15->_args = (OperandPack *)0x0;
      (unaff_R15->super_InstNode).super_BaseNode.field_1._any._nodeType = kInvoke;
      (unaff_R15->_rets)._data[0]._signature = 0;
      (unaff_R15->_rets)._data[0]._baseId = 0;
      (unaff_R15->_rets)._data[0]._data[0] = 0;
      (unaff_R15->_rets)._data[0]._data[1] = 0;
      (unaff_R15->_rets)._data[1]._signature = 0;
      (unaff_R15->_rets)._data[1]._baseId = 0;
      (unaff_R15->_rets)._data[1]._data[0] = 0;
      (unaff_R15->_rets)._data[1]._data[1] = 0;
      (unaff_R15->_rets)._data[2]._signature = 0;
      (unaff_R15->_rets)._data[2]._baseId = 0;
      (unaff_R15->_rets)._data[2]._data[0] = 0;
      (unaff_R15->_rets)._data[2]._data[1] = 0;
      (unaff_R15->_rets)._data[3]._signature = 0;
      (unaff_R15->_rets)._data[3]._baseId = 0;
      (unaff_R15->_rets)._data[3]._data[0] = 0;
      (unaff_R15->_rets)._data[3]._data[1] = 0;
      (unaff_R15->super_InstNode)._opArray[1]._data[0] = 0;
      (unaff_R15->super_InstNode)._opArray[1]._data[1] = 0;
      (unaff_R15->super_InstNode)._opArray[2]._signature = 0;
      (unaff_R15->super_InstNode)._opArray[2]._baseId = 0;
      (unaff_R15->super_InstNode)._opArray[2]._data[0] = 0;
      (unaff_R15->super_InstNode)._opArray[2]._data[1] = 0;
      (unaff_R15->super_InstNode)._opArray[3]._signature = 0;
      (unaff_R15->super_InstNode)._opArray[3]._baseId = 0;
      (unaff_R15->super_InstNode)._opArray[3]._data[0] = 0;
      (unaff_R15->super_InstNode)._opArray[3]._data[1] = 0;
      (unaff_R15->super_InstNode)._opArray[0]._data[0] = 0;
      (unaff_R15->super_InstNode)._opArray[0]._data[1] = 0;
      (unaff_R15->super_InstNode)._opArray[1]._signature = 0;
      (unaff_R15->super_InstNode)._opArray[1]._baseId = 0;
      (unaff_R15->super_InstNode)._baseInst._extraReg._signature = 0;
      (unaff_R15->super_InstNode)._baseInst._extraReg._id = 0;
      (unaff_R15->super_InstNode)._opArray[0]._signature = 0;
      (unaff_R15->super_InstNode)._opArray[0]._baseId = 0;
      (unaff_R15->super_InstNode).super_BaseNode.field_1._any._nodeFlags =
           NVar1 | (kActsAsInst|kIsRemovable|kIsCode);
      (unaff_R15->super_InstNode).super_BaseNode.field_1._any._reserved0 = '\x01';
      uVar3 = o0->_baseId;
      uVar2 = *(undefined8 *)o0->_data;
      (unaff_R15->super_InstNode)._opArray[0]._signature = (Signature)(o0->_signature)._bits;
      (unaff_R15->super_InstNode)._opArray[0]._baseId = uVar3;
      *(undefined8 *)(unaff_R15->super_InstNode)._opArray[0]._data = uVar2;
      iVar5 = 4;
      goto LAB_00119cfa;
    }
  }
  EVar4 = BaseEmitter::reportError((BaseEmitter *)unaff_R14,1,(char *)0x0);
  if (EVar4 == 0) {
    uVar6 = (ulong)DAT_00000013;
    (unaff_R15->super_InstNode).super_BaseNode.field_1._any._reserved0 = '\x01';
    o0 = unaff_R12;
    this = unaff_R14;
    if (uVar6 == 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/../core/../core/builder.h"
                 ,0x331,"index < opCapacity()");
    }
    while( true ) {
      uVar3 = o0->_baseId;
      uVar2 = *(undefined8 *)o0->_data;
      (unaff_R15->super_InstNode)._opArray[0]._signature = (Signature)(o0->_signature)._bits;
      (unaff_R15->super_InstNode)._opArray[0]._baseId = uVar3;
      *(undefined8 *)(unaff_R15->super_InstNode)._opArray[0]._data = uVar2;
      iVar5 = (int)uVar6;
      if (iVar5 != 1) {
LAB_00119cfa:
        memset((unaff_R15->super_InstNode)._opArray + 1,0,
               ((ulong)(uint)(iVar5 << 4) + 0xfffffffe0 & 0xffffffff0) + 0x10);
      }
      EVar4 = FuncDetail::init(&unaff_R15->_funcDetail,(EVP_PKEY_CTX *)local_40);
      if (EVar4 != 0) goto LAB_00119d97;
      if (local_40->_argCount == 0) goto LAB_00119d83;
      if (local_50->_zone != (Zone *)0x0) break;
      newInvokeNode();
      uVar6 = extraout_RAX;
    }
    size = (ulong)local_40->_argCount << 6;
    __s = (OperandPack *)ZoneAllocator::_alloc(local_50,size,&local_38);
    unaff_R15->_args = __s;
    if (__s == (OperandPack *)0x0) {
      EVar4 = 1;
LAB_00119d97:
      EVar4 = BaseEmitter::reportError((BaseEmitter *)this,EVar4,(char *)0x0);
    }
    else {
      memset(__s,0,size);
LAB_00119d83:
      *local_48 = unaff_R15;
      EVar4 = 0;
    }
  }
  return EVar4;
}

Assistant:

void BaseCompiler::rename(const BaseReg& reg, const char* fmt, ...) {
  if (!reg.isVirtReg()) return;

  VirtReg* vReg = virtRegById(reg.id());
  if (!vReg) return;

  if (fmt && fmt[0] != '\0') {
    char buf[128];
    va_list ap;

    va_start(ap, fmt);
    vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
    va_end(ap);

    vReg->_name.setData(&_dataZone, buf, SIZE_MAX);
  }
  else {
    BaseCompiler_assignGenericName(this, vReg);
  }
}